

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void hgdb::json::SymbolTable::walk_up<true>
               (ScopeBase *scope,function<bool_(hgdb::json::ScopeBase_*)> *terminate)

{
  ScopeBase *scope_00;
  bool bVar1;
  ScopeBase *in_RAX;
  uint64_t uVar2;
  pointer puVar3;
  _Head_base<0UL,_hgdb::json::ScopeBase_*,_false> local_38;
  
  scope_00 = scope->parent;
  if (scope_00 == (ScopeBase *)0x0) {
    return;
  }
  puVar3 = (scope->scopes_).
           super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38._M_head_impl = in_RAX;
  while (puVar3 != (scope->scopes_).
                   super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
    local_38._M_head_impl =
         puVar3[-1]._M_t.
         super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>.
         _M_t.
         super__Tuple_impl<0UL,_hgdb::json::ScopeBase_*,_std::default_delete<hgdb::json::ScopeBase>_>
         .super__Head_base<0UL,_hgdb::json::ScopeBase_*,_false>._M_head_impl;
    if ((terminate->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001fde67;
    puVar3 = puVar3 + -1;
    bVar1 = (*terminate->_M_invoker)((_Any_data *)terminate,&local_38._M_head_impl);
    if (bVar1) {
      return;
    }
  }
  uVar2 = scope->index_;
  while( true ) {
    bVar1 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar1) {
      walk_up<false>(scope_00,terminate);
      return;
    }
    local_38._M_head_impl =
         *(ScopeBase **)
          &(scope_00->scopes_).
           super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar2]._M_t.
           super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
           ._M_t;
    if ((terminate->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    bVar1 = (*terminate->_M_invoker)((_Any_data *)terminate,&local_38._M_head_impl);
    if (bVar1) {
      return;
    }
  }
LAB_001fde67:
  std::__throw_bad_function_call();
}

Assistant:

static void walk_up(ScopeBase *scope, const std::function<bool(ScopeBase *)> &terminate) {
        auto *parent = scope->parent;
        if (!parent) return;
        if constexpr (include_current) {
            // NOLINTNEXTLINE
            for (auto child = scope->rbegin(); child != scope->rend(); child++) {
                auto res = terminate(child->get());
                if (res) return;
            }
        }

        for (auto i = scope->index_; i > 0; i--) {
            auto &s = parent->operator[](i - 1);
            auto res = terminate(&s);
            if (res) return;
        }
        walk_up<false>(parent, terminate);
    }